

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  ushort *puVar1;
  ushort *puVar2;
  byte *pbVar3;
  byte bVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  BYTE *s_1;
  ushort *__src;
  uint uVar8;
  int iVar9;
  char cVar10;
  ushort *puVar11;
  ulong uVar12;
  uint uVar13;
  BYTE *s_2;
  byte *pbVar14;
  long lVar15;
  long lVar16;
  byte *pbVar17;
  BYTE *d;
  byte *pbVar18;
  byte *__dest;
  byte *pbVar19;
  byte *pbVar20;
  ulong uVar21;
  long lVar22;
  ulong uStack_80;
  int local_60;
  
  __src = (ushort *)0xffffffffffffffff;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        __src = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar2 = (ushort *)(source + compressedSize);
      pbVar3 = (byte *)(dest + maxOutputSize);
      puVar11 = (ushort *)source;
      __dest = (byte *)dest;
      if (maxOutputSize < 0x40) goto LAB_00104944;
      puVar1 = (ushort *)((long)puVar2 - 0xf);
      pbVar18 = (byte *)source;
      lVar16 = 0;
LAB_001043fe:
      do {
        __dest = (byte *)(dest + lVar16);
        bVar4 = (byte)*puVar11;
        uVar8 = (uint)bVar4;
        __src = (ushort *)((long)puVar11 + 1);
        uVar21 = (ulong)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          uVar21 = 0xf;
          puVar11 = __src;
          if (__src < puVar1) {
            uVar13 = 0;
            do {
              uVar6 = *puVar11;
              puVar11 = (ushort *)((long)puVar11 + 1);
              uVar13 = uVar13 + (byte)uVar6;
            } while (puVar11 < puVar1 && (byte)uVar6 == 0xff);
            uVar21 = (ulong)uVar13 + 0xf;
          }
          if (((puVar1 <= __src) || (CARRY8((ulong)__dest,uVar21))) ||
             (CARRY8((ulong)puVar11,uVar21))) {
            iVar9 = 5;
          }
          else {
            pbVar18 = (byte *)(dest + uVar21 + lVar16);
            if ((pbVar3 + -0x20 < pbVar18) || (puVar2 + -0x10 < (ushort *)((long)puVar11 + uVar21)))
            {
              iVar9 = 6;
            }
            else {
              __src = (ushort *)0x0;
              do {
                uVar5 = *(undefined8 *)((byte *)((long)puVar11 + (long)__src) + 8);
                pbVar19 = __dest + (long)__src;
                *(undefined8 *)pbVar19 = *(undefined8 *)((long)puVar11 + (long)__src);
                *(undefined8 *)(pbVar19 + 8) = uVar5;
                uVar5 = *(undefined8 *)((byte *)((long)(puVar11 + 8) + (long)__src) + 8);
                *(undefined8 *)(pbVar19 + 0x10) = *(undefined8 *)((long)(puVar11 + 8) + (long)__src)
                ;
                *(undefined8 *)(pbVar19 + 0x18) = uVar5;
                __src = __src + 0x10;
              } while (pbVar19 + 0x20 < pbVar18);
              iVar9 = 0;
              lVar16 = uVar21 + lVar16;
              puVar11 = (ushort *)((long)puVar11 + uVar21);
            }
          }
          if (iVar9 != 0) {
            if (iVar9 == 5) goto LAB_00104a06;
            if (iVar9 == 6) {
              __dest = (byte *)(dest + lVar16);
              __src = puVar11;
              goto LAB_0010484c;
            }
            break;
          }
        }
        else {
          lVar16 = lVar16 + uVar21;
          pbVar18 = (byte *)(dest + lVar16);
          if ((ushort *)((long)puVar2 - 0x11U) < __src) goto LAB_0010484c;
          uVar5 = *(undefined8 *)((long)puVar11 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar5;
          puVar11 = (ushort *)(uVar21 + (long)__src);
        }
        pbVar19 = (byte *)(dest + lVar16);
        uVar6 = *puVar11;
        uVar12 = (ulong)uVar6;
        puVar11 = puVar11 + 1;
        lVar22 = lVar16 - uVar12;
        pbVar17 = (byte *)(dest + lVar22);
        uStack_80 = (ulong)(bVar4 & 0xf);
        if (uStack_80 == 0xf) {
          if (lVar22 < -0x10000) {
            iVar9 = 5;
            uStack_80 = 0xf;
          }
          else {
            uVar8 = 0;
            do {
              uVar7 = *puVar11;
              puVar11 = (ushort *)((long)puVar11 + 1);
              uVar8 = uVar8 + (byte)uVar7;
            } while ((byte)uVar7 == 0xff && puVar11 < puVar2 + -2);
            uVar21 = (ulong)uVar8;
            uStack_80 = uVar21 + 0xf;
            if ((puVar2 + -2 <= puVar11) || (CARRY8((ulong)pbVar19,uStack_80))) {
              iVar9 = 5;
            }
            else {
              uStack_80 = uVar21 + 0x13;
              iVar9 = 7;
              if (pbVar19 + uVar21 + 0x13 < pbVar3 + -0x40) {
                iVar9 = 0;
              }
            }
          }
          if (iVar9 != 0) {
            if (iVar9 == 5) goto LAB_00104a06;
            __src = puVar11;
            if (iVar9 != 7) break;
            goto LAB_001048e3;
          }
        }
        else {
          lVar15 = lVar16 + uStack_80 + 4;
          uStack_80 = uStack_80 + 4;
          if (pbVar3 + -0x40 <= dest + lVar15) goto LAB_001048e3;
          if (7 < uVar6) {
            *(undefined8 *)pbVar19 = *(undefined8 *)pbVar17;
            *(undefined8 *)(pbVar19 + 8) = *(undefined8 *)(pbVar17 + 8);
            *(undefined2 *)(pbVar19 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
            lVar16 = lVar15;
            goto LAB_001043fe;
          }
        }
        if (lVar22 < -0x10000) goto LAB_00104a06;
        lVar16 = uStack_80 + lVar16;
        pbVar18 = (byte *)(dest + lVar16);
        if (uVar6 < 0x10) {
          if (uVar12 == 4) {
            iVar9 = *(int *)pbVar17;
          }
          else if (uVar6 == 2) {
            iVar9 = CONCAT22(*(undefined2 *)pbVar17,*(undefined2 *)pbVar17);
          }
          else {
            if (uVar6 != 1) {
              if (uVar6 < 8) {
                pbVar19[0] = 0;
                pbVar19[1] = 0;
                pbVar19[2] = 0;
                pbVar19[3] = 0;
                *pbVar19 = *pbVar17;
                pbVar19[1] = pbVar17[1];
                pbVar19[2] = pbVar17[2];
                pbVar19[3] = pbVar17[3];
                uVar8 = inc32table[uVar6];
                *(undefined4 *)(pbVar19 + 4) = *(undefined4 *)(pbVar17 + uVar8);
                pbVar17 = pbVar17 + ((ulong)uVar8 - (long)dec64table[uVar6]);
              }
              else {
                *(undefined8 *)pbVar19 = *(undefined8 *)pbVar17;
                pbVar17 = pbVar17 + 8;
              }
              pbVar19 = pbVar19 + 8;
              do {
                *(undefined8 *)pbVar19 = *(undefined8 *)pbVar17;
                pbVar19 = pbVar19 + 8;
                pbVar17 = pbVar17 + 8;
              } while (pbVar19 < pbVar18);
              goto LAB_001043fe;
            }
            iVar9 = (uint)*pbVar17 * 0x1010101;
          }
          do {
            *(int *)pbVar19 = iVar9;
            *(int *)(pbVar19 + 4) = iVar9;
            pbVar19 = pbVar19 + 8;
          } while (pbVar19 < pbVar18);
          goto LAB_001043fe;
        }
        do {
          uVar5 = *(undefined8 *)(pbVar19 + -uVar12 + 8);
          *(undefined8 *)pbVar19 = *(undefined8 *)(pbVar19 + -uVar12);
          *(undefined8 *)(pbVar19 + 8) = uVar5;
          uVar5 = *(undefined8 *)(pbVar19 + -uVar12 + 0x10 + 8);
          *(undefined8 *)(pbVar19 + 0x10) = *(undefined8 *)(pbVar19 + -uVar12 + 0x10);
          *(undefined8 *)(pbVar19 + 0x18) = uVar5;
          pbVar19 = pbVar19 + 0x20;
        } while (pbVar19 < pbVar18);
      } while( true );
    }
  }
LAB_00104746:
  return (int)__src;
LAB_001048e3:
  if (pbVar17 < dest + -0x10000) goto LAB_00104a06;
  __dest = pbVar19 + uStack_80;
  if ((uint)uVar12 < 8) {
    pbVar19[0] = 0;
    pbVar19[1] = 0;
    pbVar19[2] = 0;
    pbVar19[3] = 0;
    *pbVar19 = *pbVar17;
    pbVar19[1] = pbVar17[1];
    pbVar19[2] = pbVar17[2];
    pbVar19[3] = pbVar17[3];
    uVar12 = (ulong)((uint)uVar12 << 2);
    uVar21 = (ulong)*(uint *)((long)inc32table + uVar12);
    *(undefined4 *)(pbVar19 + 4) = *(undefined4 *)(pbVar17 + uVar21);
    pbVar17 = pbVar17 + (uVar21 - (long)*(int *)((long)dec64table + uVar12));
  }
  else {
    *(undefined8 *)pbVar19 = *(undefined8 *)pbVar17;
    pbVar17 = pbVar17 + 8;
  }
  pbVar18 = pbVar19 + 8;
  if (pbVar3 + -0xc < __dest) {
    iVar9 = 5;
    if (__dest <= pbVar3 + -5) {
      pbVar19 = pbVar3 + -7;
      pbVar14 = pbVar17;
      pbVar20 = pbVar18;
      if (pbVar18 < pbVar19) {
        do {
          *(undefined8 *)pbVar20 = *(undefined8 *)pbVar14;
          pbVar20 = pbVar20 + 8;
          pbVar14 = pbVar14 + 8;
        } while (pbVar20 < pbVar19);
        pbVar17 = pbVar17 + ((long)pbVar19 - (long)pbVar18);
        pbVar18 = pbVar19;
      }
      iVar9 = 0;
      for (; pbVar18 < __dest; pbVar18 = pbVar18 + 1) {
        bVar4 = *pbVar17;
        pbVar17 = pbVar17 + 1;
        *pbVar18 = bVar4;
      }
    }
    if (iVar9 != 0) {
      __src = puVar11;
      if (iVar9 != 5) goto LAB_00104746;
      goto LAB_00104a06;
    }
  }
  else {
    *(undefined8 *)pbVar18 = *(undefined8 *)pbVar17;
    if (0x10 < uStack_80) {
      pbVar19 = pbVar19 + 0x10;
      do {
        pbVar17 = pbVar17 + 8;
        *(undefined8 *)pbVar19 = *(undefined8 *)pbVar17;
        pbVar19 = pbVar19 + 8;
      } while (pbVar19 < __dest);
    }
  }
LAB_00104944:
  bVar4 = (byte)*puVar11;
  __src = (ushort *)((long)puVar11 + 1);
  while( true ) {
    uVar8 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar21 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= __src) ||
       (dest + (long)maxOutputSize + -0x20 < __dest)) goto LAB_00104848;
    uVar5 = *(undefined8 *)(__src + 4);
    *(undefined8 *)__dest = *(undefined8 *)__src;
    *(undefined8 *)(__dest + 8) = uVar5;
    pbVar18 = __dest + uVar21;
    uStack_80 = (ulong)(uVar8 & 0xf);
    puVar11 = (ushort *)((long)__src + uVar21) + 1;
    uVar6 = *(ushort *)((long)__src + uVar21);
    uVar12 = (ulong)uVar6;
    pbVar17 = pbVar18 + -uVar12;
    if (((uVar8 & 0xf) == 0xf) || (uVar6 < 8)) goto LAB_00104894;
    *(undefined8 *)pbVar18 = *(undefined8 *)pbVar17;
    *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar17 + 8);
    *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
    __dest = pbVar18 + uStack_80 + 4;
    bVar4 = *(byte *)((long)__src + uVar21 + 2);
    __src = (ushort *)((long)__src + uVar21 + 3);
  }
  puVar1 = (ushort *)((long)puVar2 - 0xf);
  uVar21 = 0xf;
  puVar11 = __src;
  if (__src < puVar1) {
    uVar13 = 0;
    do {
      uVar6 = *puVar11;
      puVar11 = (ushort *)((long)puVar11 + 1);
      uVar13 = uVar13 + (byte)uVar6;
    } while (puVar11 < puVar1 && (byte)uVar6 == 0xff);
    uVar21 = (ulong)uVar13 + 0xf;
  }
  if (((puVar1 <= __src) || (CARRY8((ulong)__dest,uVar21))) ||
     (__src = puVar11, CARRY8((ulong)puVar11,uVar21))) goto LAB_00104a06;
LAB_00104848:
  pbVar18 = __dest + uVar21;
LAB_0010484c:
  puVar1 = (ushort *)((long)__src + uVar21);
  if ((pbVar3 + -0xc < pbVar18) || (puVar2 + -4 < puVar1)) {
    puVar11 = __src;
    if ((puVar1 == puVar2) && (pbVar18 <= pbVar3)) {
      memmove(__dest,__src,uVar21);
      __src = (ushort *)(ulong)(uint)(((int)__dest + (int)uVar21) - (int)dest);
      goto LAB_00104746;
    }
    goto LAB_00104a06;
  }
  do {
    *(undefined8 *)__dest = *(undefined8 *)__src;
    __dest = __dest + 8;
    __src = __src + 4;
  } while (__dest < pbVar18);
  uVar12 = (ulong)*puVar1;
  puVar11 = puVar1 + 1;
  pbVar17 = pbVar18 + -uVar12;
  uStack_80 = (ulong)(uVar8 & 0xf);
LAB_00104894:
  if ((int)uStack_80 == 0xf) {
    uVar8 = 0;
    do {
      uVar6 = *puVar11;
      puVar11 = (ushort *)((long)puVar11 + 1);
      uVar8 = uVar8 + (byte)uVar6;
    } while (puVar11 < puVar2 + -2 && (byte)uVar6 == 0xff);
    uStack_80 = (ulong)uVar8 + 0xf;
    cVar10 = '\x05';
    if (puVar11 < puVar2 + -2) {
      cVar10 = CARRY8((ulong)pbVar18,uStack_80) * '\x05';
    }
    if (cVar10 != '\0') {
      __src = puVar11;
      if (cVar10 != '\x05') goto LAB_00104746;
      goto LAB_00104a06;
    }
  }
  uStack_80 = uStack_80 + 4;
  pbVar19 = pbVar18;
  goto LAB_001048e3;
LAB_00104a06:
  local_60 = (int)source;
  __src = (ushort *)(ulong)(~(uint)puVar11 + local_60);
  goto LAB_00104746;
}

Assistant:

LZ4_FORCE_O2 /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}